

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O3

RCOError __thiscall
RCO::getFileData(RCO *this,uint8_t **filedata,uint32_t *outlen,uint32_t offset,uint32_t size,
                bool isCompressed,uint32_t originalSize)

{
  uint8_t *__dest;
  void *__src;
  uint8_t *__dest_00;
  ulong uVar1;
  uLongf destlen;
  ulong local_38;
  
  uVar1 = (ulong)size;
  __dest = (uint8_t *)operator_new__(uVar1);
  *filedata = __dest;
  *outlen = size;
  memcpy(__dest,this->mBuffer + (ulong)offset + (ulong)(this->mHeader).file_table_off,uVar1);
  if (originalSize != 0 && isCompressed) {
    __src = operator_new__((ulong)originalSize);
    local_38 = (ulong)originalSize;
    uncompress(__src,&local_38,__dest,uVar1);
    uVar1 = local_38;
    __dest_00 = (uint8_t *)operator_new__(local_38);
    memcpy(__dest_00,__src,uVar1);
    *filedata = __dest_00;
    *outlen = (uint32_t)uVar1;
    operator_delete__(__src);
    operator_delete__(__dest);
  }
  return NO_ERROR;
}

Assistant:

RCOError RCO::getFileData(uint8_t **filedata, uint32_t &outlen, uint32_t offset, uint32_t size, bool isCompressed, uint32_t originalSize)
{
	*filedata = new uint8_t[size];

	uint8_t *fdata = *filedata;
	outlen = size;

	memcpy(fdata, mBuffer + mHeader.file_table_off + offset, size * sizeof(uint8_t));

	if (isCompressed)
	{
		if (originalSize <= 0)
			return NO_ERROR;

		uint8_t *deflated = new uint8_t[originalSize];

		uLongf destlen = originalSize;//1024 * 1024 * 10;

		uncompress(deflated, &destlen, fdata, size);

		uint8_t *deflated_final = new uint8_t[destlen];
		memcpy(deflated_final, deflated, destlen);

		*filedata = deflated_final;
		outlen = destlen;

		delete[] deflated;
		delete[] fdata;
	}

	return NO_ERROR;

}